

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedArrayStrideTypeAggregateSubCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               string *namePrefix,ProgramInterface interface,DataType type,int expandLevel)

{
  Node *pNVar1;
  pointer pcVar2;
  undefined8 uVar3;
  DataType type_00;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  ResourceTestCase *this;
  deInt32 *pdVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SharedPtr structMember;
  SharedPtr arrayElement;
  undefined1 local_78 [32];
  SharedPtr local_58;
  SharedPtr local_48;
  DataType local_34;
  
  pNVar4 = (Node *)operator_new(0x28);
  pNVar1 = parentStructure->m_ptr;
  pSVar5 = parentStructure->m_state;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar4->m_type = TYPE_VARIABLE;
  (pNVar4->m_enclosingNode).m_ptr = pNVar1;
  (pNVar4->m_enclosingNode).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
  *(DataType *)&pNVar4[1]._vptr_Node = type;
  local_78._0_8_ = pNVar4;
  local_34 = type;
  pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar5->strongRefCount = 0;
  pSVar5->weakRefCount = 0;
  pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar5->strongRefCount = 1;
  pSVar5->weakRefCount = 1;
  local_78._8_8_ = pSVar5;
  this = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_58,interface,4);
  ResourceTestCase::ResourceTestCase
            (this,context,(SharedPtr *)local_78,(ProgramResourceQueryTestTarget *)&local_58,
             (namePrefix->_M_dataplus)._M_p);
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this);
  uVar3 = local_78._8_8_;
  pdVar6 = &pSVar5->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_78._0_8_ = (Node *)0x0;
    (*(*(_func_int ***)local_78._8_8_)[2])(local_78._8_8_);
  }
  LOCK();
  pdVar6 = (deInt32 *)(uVar3 + 0xc);
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && ((SharedPtrStateBase *)local_78._8_8_ != (SharedPtrStateBase *)0x0)) {
    (*(*(_func_int ***)local_78._8_8_)[1])();
  }
  if (0 < expandLevel) {
    pNVar4 = (Node *)operator_new(0x20);
    pNVar1 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar1;
    (pNVar4->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar4;
    local_58.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_58.m_state)->strongRefCount = 0;
    (local_58.m_state)->weakRefCount = 0;
    (local_58.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_58.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    (local_58.m_state)->strongRefCount = 1;
    (local_58.m_state)->weakRefCount = 1;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar1 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar1;
    (pNVar4->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    local_48.m_state = (SharedPtrStateBase *)0x0;
    local_48.m_ptr = pNVar4;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    pNVar1 = (Node *)(local_78 + 0x10);
    pcVar2 = (namePrefix->_M_dataplus)._M_p;
    local_78._0_8_ = pNVar1;
    local_48.m_state = pSVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar2,pcVar2 + namePrefix->_M_string_length);
    std::__cxx11::string::append(local_78);
    type_00 = local_34;
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (context,&local_58,targetGroup,(string *)local_78,interface,local_34,0);
    if ((Node *)local_78._0_8_ != pNVar1) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    pcVar2 = (namePrefix->_M_dataplus)._M_p;
    local_78._0_8_ = pNVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar2,pcVar2 + namePrefix->_M_string_length);
    std::__cxx11::string::append(local_78);
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (context,&local_48,targetGroup,(string *)local_78,interface,type_00,0);
    pdVar6 = &pSVar5->strongRefCount;
    if ((Node *)local_78._0_8_ != pNVar1) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    pSVar5 = local_48.m_state;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_48.m_ptr = (Node *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])(local_48.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar5 = local_58.m_state;
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_58.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  return;
}

Assistant:

static void generateBufferBackedArrayStrideTypeAggregateSubCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const std::string& namePrefix, ProgramInterface interface, glu::DataType type, int expandLevel)
{
	// case
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, type));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, PROGRAMRESOURCEPROP_ARRAY_STRIDE), namePrefix.c_str()));
	}

	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));

		// _struct
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, structMember, targetGroup, namePrefix + "_struct", interface, type, expandLevel - 1);

		// _array
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, arrayElement, targetGroup, namePrefix + "_array", interface, type, expandLevel - 1);
	}
}